

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O1

bool __thiscall Js::JavascriptWeakMap::Delete(JavascriptWeakMap *this,RecyclableObject *key)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  WeakMapKeyMap *this_00;
  undefined4 *puVar4;
  void *local_38;
  RecyclableObject *local_30;
  RecyclableObject *key_local;
  bool unused;
  
  local_30 = key;
  this_00 = GetWeakMapKeyMapFromKey(this,key);
  if (this_00 == (WeakMapKeyMap *)0x0) {
    bVar3 = false;
  }
  else {
    key_local._7_1_ = 0;
    bVar2 = JsUtil::
            SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            ::TryGetValueAndRemove
                      (&(this->keySet).
                        super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                       ,&local_30,(TBValue *)((long)&key_local + 7));
    local_38 = (void *)((ulong)this | 1);
    bVar3 = JsUtil::
            BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Remove(this_00,&local_38);
    if (bVar2 != bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakMap.cpp"
                                  ,0x14a,"(inSet == inData)","inSet == inData");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return bVar3;
}

Assistant:

bool JavascriptWeakMap::Delete(RecyclableObject* key)
    {
        WeakMapKeyMap* keyMap = GetWeakMapKeyMapFromKey(key);

        if (keyMap != nullptr)
        {
            bool unused = false;
            bool inSet = keySet.TryGetValueAndRemove(key, &unused);
            bool inData = keyMap->Remove(GetWeakMapId());
            Assert(inSet == inData);

            return inData;
        }

        return false;
    }